

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePickerPrivate::findMovableSection(DateTimePickerPrivate *this,QPointF *pos)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  lVar1 = (this->super_DateTimeParser).sections.d.size;
  iVar3 = -1;
  if (0 < lVar1) {
    piVar4 = &((this->super_DateTimeParser).sections.d.ptr)->sectionWidth;
    lVar5 = 0;
    iVar6 = 0;
    do {
      bVar2 = iVar6 <= (int)pos->xp;
      iVar6 = iVar6 + *piVar4;
      if ((int)pos->xp < iVar6 && bVar2) {
        iVar3 = (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + 0xc;
    } while (lVar1 != lVar5);
  }
  this->movableSection = iVar3;
  return;
}

Assistant:

void
DateTimePickerPrivate::findMovableSection( const QPointF & pos )
{
	const int x = pos.x();

	int width = 0;

	for( int i = 0; i < sections.size(); ++i )
	{
		if( x >= width && x < width + sections.at( i ).sectionWidth )
		{
			movableSection = i;
			return;
		}

		width += sections.at( i ).sectionWidth;
	}

	movableSection = -1;
}